

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

bool __thiscall
BackwardPass::IsImplicitCallBailOutCurrentlyNeeded
          (BackwardPass *this,Instr *instr,bool mayNeedImplicitCallBailOut,bool needLazyBailOut,
          bool hasLiveFields)

{
  bool bVar1;
  bool local_1c;
  bool hasLiveFields_local;
  bool needLazyBailOut_local;
  bool mayNeedImplicitCallBailOut_local;
  Instr *instr_local;
  BackwardPass *this_local;
  
  bVar1 = GlobOpt::IsImplicitCallBailOutCurrentlyNeeded
                    (this->globOpt,instr,(Value *)0x0,(Value *)0x0,this->currentBlock,hasLiveFields,
                     mayNeedImplicitCallBailOut,false,needLazyBailOut);
  local_1c = true;
  if (!bVar1) {
    local_1c = NeedBailOutOnImplicitCallsForTypedArrayStore(this,instr);
  }
  return local_1c;
}

Assistant:

bool
BackwardPass::IsImplicitCallBailOutCurrentlyNeeded(IR::Instr * instr, bool mayNeedImplicitCallBailOut, bool needLazyBailOut, bool hasLiveFields)
{
    return this->globOpt->IsImplicitCallBailOutCurrentlyNeeded(
        instr, nullptr /* src1Val */, nullptr /* src2Val */,
        this->currentBlock, hasLiveFields, mayNeedImplicitCallBailOut, false /* isForwardPass */, needLazyBailOut
    ) ||
    this->NeedBailOutOnImplicitCallsForTypedArrayStore(instr);
}